

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O0

MPI_Datatype mxx::datatype_builder<std::pair<int,_int>_>::get_type(void)

{
  int aiVar1 [2];
  undefined8 local_60;
  MPI_Datatype struct_type;
  MPI_Datatype types [2];
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  pair<int,_int> p;
  MPI_Aint displs [2];
  int blocklen [2];
  MPI_Datatype _type;
  
  displs[1] = 0x100000001;
  memset(&p,0,0x10);
  std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&p_adr);
  MPI_Get_address(&p_adr,&t1_adr);
  MPI_Get_address(&p_adr,&t2_adr);
  MPI_Get_address((long)&p_adr + 4,types + 1);
  p = (pair<int,_int>)(t2_adr - t1_adr);
  displs[0] = (long)types[1] - t1_adr;
  struct_type = datatype_builder<int>::get_type();
  types[0] = datatype_builder<int>::get_type();
  if (displs[0] < (long)p) {
    std::swap<long>((long *)&p,displs);
    std::swap<ompi_datatype_t*>(&struct_type,types);
  }
  MPI_Type_create_struct(2,displs + 1,&p,&struct_type,&local_60);
  MPI_Type_create_resized(local_60,0,8,blocklen);
  MPI_Type_commit(blocklen);
  MPI_Type_free(&local_60);
  aiVar1[0] = blocklen[0];
  aiVar1[1] = blocklen[1];
  return (MPI_Datatype)aiVar1;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }